

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O3

void traitor_pulse(CHAR_DATA *ch,AFFECT_DATA *af)

{
  bool bVar1;
  
  if (af->owner != (CHAR_DATA *)0x0) {
    bVar1 = is_same_group(ch,af->owner);
    if ((!bVar1) && (af->duration == -1)) {
      af->duration = 10;
    }
    return;
  }
  affect_remove(ch,af);
  return;
}

Assistant:

void traitor_pulse(CHAR_DATA *ch, AFFECT_DATA *af)
{
	if (!af->owner)
	{
		affect_remove(ch, af);
		return;
	}

	if (!is_same_group(ch, af->owner) && af->duration == -1)
	{
		af->duration = 10;
		return;
	}
}